

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O2

cram_block_compression_hdr * cram_decode_compression_header(cram_fd *fd,cram_block *b)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  khint_t kVar5;
  uint uVar6;
  cram_block_compression_hdr *hdr;
  int32_t *piVar7;
  kh_map_t *pkVar8;
  cram_map *pcVar9;
  cram_codec *pcVar10;
  cram_block_compression_hdr *pcVar11;
  long lVar12;
  ulong uVar13;
  byte *unaff_RBP;
  cram_encoding cVar14;
  long lVar15;
  byte *pbVar16;
  byte *pbVar17;
  uint uVar18;
  uint uVar19;
  char *key;
  ulong uVar20;
  bool bVar21;
  long lStack_70;
  int r;
  byte *local_50;
  byte *local_48;
  cram_map **local_40;
  cram_block *local_38;
  
  lVar15 = 1;
  hdr = (cram_block_compression_hdr *)calloc(1,0x418);
  if (hdr == (cram_block_compression_hdr *)0x0) {
    return (cram_block_compression_hdr *)0x0;
  }
  if ((b->method != RAW) && (iVar4 = cram_uncompress_block(b), iVar4 != 0)) {
LAB_0011468c:
    free(hdr);
    return (cram_block_compression_hdr *)0x0;
  }
  pbVar17 = b->data;
  local_38 = b;
  if ((fd->version & 0xffffff00U) == 0x100) {
    bVar1 = *pbVar17;
    uVar18 = (uint)bVar1;
    lVar12 = lVar15;
    if ((char)bVar1 < '\0') {
      uVar19 = (uint)bVar1;
      uVar18 = (uint)pbVar17[1];
      if (bVar1 < 0xc0) {
        uVar18 = (uVar19 & 0x3f) << 8 | uVar18;
        lStack_70 = 2;
        lVar12 = lStack_70;
      }
      else if (bVar1 < 0xe0) {
        uVar18 = (uVar19 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar17[2];
        lStack_70 = 3;
        lVar12 = lStack_70;
      }
      else if (bVar1 < 0xf0) {
        uVar18 = (uVar19 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)pbVar17[2] << 8 | (uint)pbVar17[3];
        lStack_70 = 4;
        lVar12 = lStack_70;
      }
      else {
        uVar18 = pbVar17[4] & 0xf |
                 (uint)pbVar17[3] << 4 | (uint)pbVar17[2] << 0xc | uVar18 << 0x14 | uVar19 << 0x1c;
        lStack_70 = 5;
        lVar12 = lStack_70;
      }
    }
    hdr->ref_seq_id = uVar18;
    bVar1 = pbVar17[lVar12];
    uVar18 = (uint)bVar1;
    lStack_70 = lVar15;
    if ((char)bVar1 < '\0') {
      uVar19 = (uint)bVar1;
      uVar18 = (uint)pbVar17[lVar12 + 1];
      if (bVar1 < 0xc0) {
        uVar18 = (uVar19 & 0x3f) << 8 | uVar18;
        lStack_70 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar18 = (uVar19 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar17[lVar12 + 2];
        lStack_70 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar18 = (uVar19 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)pbVar17[lVar12 + 2] << 8 |
                 (uint)pbVar17[lVar12 + 3];
        lStack_70 = 4;
      }
      else {
        uVar18 = pbVar17[lVar12 + 4] & 0xf |
                 (uint)pbVar17[lVar12 + 3] << 4 |
                 (uint)pbVar17[lVar12 + 2] << 0xc | uVar18 << 0x14 | uVar19 << 0x1c;
        lStack_70 = 5;
      }
    }
    hdr->ref_seq_start = uVar18;
    lVar3 = lStack_70 + lVar12;
    bVar1 = pbVar17[lStack_70 + lVar12];
    uVar18 = (uint)bVar1;
    lStack_70 = lVar15;
    if ((char)bVar1 < '\0') {
      uVar19 = (uint)bVar1;
      uVar18 = (uint)pbVar17[lVar3 + 1];
      if (bVar1 < 0xc0) {
        uVar18 = (uVar19 & 0x3f) << 8 | uVar18;
        lStack_70 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar18 = (uVar19 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar17[lVar3 + 2];
        lStack_70 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar18 = (uVar19 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)pbVar17[lVar3 + 2] << 8 |
                 (uint)pbVar17[lVar3 + 3];
        lStack_70 = 4;
      }
      else {
        uVar18 = pbVar17[lVar3 + 4] & 0xf |
                 (uint)pbVar17[lVar3 + 3] << 4 |
                 (uint)pbVar17[lVar3 + 2] << 0xc | uVar18 << 0x14 | uVar19 << 0x1c;
        lStack_70 = 5;
      }
    }
    hdr->ref_seq_span = uVar18;
    lVar12 = lStack_70 + lVar3;
    bVar1 = pbVar17[lStack_70 + lVar3];
    uVar18 = (uint)bVar1;
    lStack_70 = lVar15;
    if ((char)bVar1 < '\0') {
      uVar19 = (uint)bVar1;
      uVar18 = (uint)pbVar17[lVar12 + 1];
      if (bVar1 < 0xc0) {
        uVar18 = (uVar19 & 0x3f) << 8 | uVar18;
        lStack_70 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar18 = (uVar19 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar17[lVar12 + 2];
        lStack_70 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar18 = (uVar19 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)pbVar17[lVar12 + 2] << 8 |
                 (uint)pbVar17[lVar12 + 3];
        lStack_70 = 4;
      }
      else {
        uVar18 = pbVar17[lVar12 + 4] & 0xf |
                 (uint)pbVar17[lVar12 + 3] << 4 |
                 (uint)pbVar17[lVar12 + 2] << 0xc | uVar18 << 0x14 | uVar19 << 0x1c;
        lStack_70 = 5;
      }
    }
    hdr->num_records = uVar18;
    lVar3 = lStack_70 + lVar12;
    bVar1 = pbVar17[lStack_70 + lVar12];
    uVar18 = (uint)bVar1;
    lStack_70 = lVar15;
    if ((char)bVar1 < '\0') {
      uVar19 = (uint)bVar1;
      uVar18 = (uint)pbVar17[lVar3 + 1];
      if (bVar1 < 0xc0) {
        uVar18 = (uVar19 & 0x3f) << 8 | uVar18;
        lStack_70 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar18 = (uVar19 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar17[lVar3 + 2];
        lStack_70 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar18 = (uVar19 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)pbVar17[lVar3 + 2] << 8 |
                 (uint)pbVar17[lVar3 + 3];
        lStack_70 = 4;
      }
      else {
        uVar18 = pbVar17[lVar3 + 4] & 0xf |
                 (uint)pbVar17[lVar3 + 3] << 4 |
                 (uint)pbVar17[lVar3 + 2] << 0xc | uVar18 << 0x14 | uVar19 << 0x1c;
        lStack_70 = 5;
      }
    }
    hdr->num_landmarks = uVar18;
    piVar7 = (int32_t *)malloc((long)(int)uVar18 << 2);
    hdr->landmark = piVar7;
    if (piVar7 == (int32_t *)0x0) goto LAB_0011468c;
    pbVar17 = pbVar17 + lStack_70 + lVar3;
    uVar13 = 0;
    uVar20 = (ulong)uVar18;
    if ((int)uVar18 < 1) {
      uVar20 = uVar13;
    }
    for (; uVar20 != uVar13; uVar13 = uVar13 + 1) {
      bVar1 = *pbVar17;
      uVar18 = (uint)bVar1;
      lVar15 = 1;
      if ((char)bVar1 < '\0') {
        uVar19 = (uint)bVar1;
        uVar18 = (uint)pbVar17[1];
        if (bVar1 < 0xc0) {
          uVar18 = (uVar19 & 0x3f) << 8 | uVar18;
          lVar15 = 2;
        }
        else if (bVar1 < 0xe0) {
          unaff_RBP = (byte *)0x0;
          uVar18 = (uVar19 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar17[2];
          lVar15 = 3;
        }
        else if (bVar1 < 0xf0) {
          unaff_RBP = (byte *)((ulong)pbVar17[2] << 8);
          uVar18 = (uVar19 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)unaff_RBP | (uint)pbVar17[3];
          lVar15 = 4;
        }
        else {
          uVar18 = pbVar17[4] & 0xf |
                   (uint)pbVar17[3] << 4 | (uint)pbVar17[2] << 0xc | uVar18 << 0x14 | uVar19 << 0x1c
          ;
          lVar15 = 5;
        }
      }
      piVar7[uVar13] = uVar18;
      pbVar17 = pbVar17 + lVar15;
    }
  }
  pkVar8 = (kh_map_t *)calloc(1,0x28);
  hdr->preservation_map = pkVar8;
  local_40 = hdr->rec_encoding_map;
  memset(local_40,0,0x200);
  if (pkVar8 == (kh_map_t *)0x0) goto LAB_001158a6;
  hdr->mapped_qs_included = 0;
  hdr->unmapped_qs_included = 0;
  hdr->unmapped_placed = 0;
  hdr->qs_included = 0;
  hdr->read_names_included = 0;
  hdr->AP_delta = 1;
  *(char *)((long)(hdr->substitution_matrix + 0) + 0) = 'C';
  *(char *)((long)(hdr->substitution_matrix + 0) + 1) = 'G';
  *(char *)((long)(hdr->substitution_matrix + 0) + 2) = 'T';
  *(char *)((long)(hdr->substitution_matrix + 0) + 3) = 'N';
  *(char *)((long)(hdr->substitution_matrix + 1) + 0) = 'A';
  *(char *)((long)(hdr->substitution_matrix + 1) + 1) = 'G';
  *(char *)((long)(hdr->substitution_matrix + 1) + 2) = 'T';
  *(char *)((long)(hdr->substitution_matrix + 1) + 3) = 'N';
  *(char *)((long)(hdr->substitution_matrix + 2) + 0) = 'A';
  *(char *)((long)(hdr->substitution_matrix + 2) + 1) = 'C';
  *(char *)((long)(hdr->substitution_matrix + 2) + 2) = 'T';
  *(char *)((long)(hdr->substitution_matrix + 2) + 3) = 'N';
  *(char *)((long)(hdr->substitution_matrix + 3) + 0) = 'A';
  *(char *)((long)(hdr->substitution_matrix + 3) + 1) = 'C';
  *(char *)((long)(hdr->substitution_matrix + 3) + 2) = 'G';
  *(char *)((long)(hdr->substitution_matrix + 3) + 3) = 'N';
  hdr->substitution_matrix[4] = (char  [4])0x54474341;
  bVar1 = *pbVar17;
  uVar18 = (uint)bVar1;
  lStack_70 = 1;
  if ((char)bVar1 < '\0') {
    uVar19 = (uint)pbVar17[1];
    uVar18 = (uint)bVar1;
    if (bVar1 < 0xc0) {
      lStack_70 = 2;
      uVar18 = (uVar18 & 0x3f) << 8;
LAB_00114717:
      uVar18 = uVar18 | uVar19;
    }
    else if (bVar1 < 0xe0) {
      uVar18 = (uVar18 & 0x1f) << 0x10 | uVar19 << 8 | (uint)pbVar17[2];
      lStack_70 = 3;
    }
    else {
      if (0xef < bVar1) {
        lStack_70 = 5;
        uVar19 = (uint)pbVar17[3] << 4 | (uint)pbVar17[2] << 0xc | uVar19 << 0x14 | uVar18 << 0x1c;
        uVar18 = pbVar17[4] & 0xf;
        goto LAB_00114717;
      }
      uVar18 = (uVar18 & 0xf) << 0x18 | uVar19 << 0x10 | (uint)pbVar17[2] << 8 | (uint)pbVar17[3];
      lStack_70 = 4;
    }
  }
  local_50 = pbVar17 + lStack_70;
  bVar1 = pbVar17[lStack_70];
  uVar19 = (uint)bVar1;
  local_48 = (byte *)CONCAT44(local_48._4_4_,uVar18);
  lStack_70 = 1;
  if ((char)bVar1 < '\0') {
    uVar18 = (uint)bVar1;
    uVar19 = (uint)local_50[1];
    if (bVar1 < 0xc0) {
      uVar19 = (uVar18 & 0x3f) << 8 | uVar19;
      lStack_70 = 2;
    }
    else if (bVar1 < 0xe0) {
      uVar19 = (uVar18 & 0x1f) << 0x10 | uVar19 << 8 | (uint)local_50[2];
      lStack_70 = 3;
    }
    else if (bVar1 < 0xf0) {
      uVar19 = (uVar18 & 0xf) << 0x18 | uVar19 << 0x10 | (uint)local_50[2] << 8 | (uint)local_50[3];
      lStack_70 = 4;
    }
    else {
      uVar19 = local_50[4] & 0xf |
               (uint)local_50[3] << 4 | (uint)local_50[2] << 0xc | uVar19 << 0x14 | uVar18 << 0x1c;
      lStack_70 = 5;
    }
  }
  pbVar17 = local_50 + lStack_70;
  if ((int)uVar19 < 1) {
    uVar19 = 0;
  }
LAB_0011484a:
  bVar21 = uVar19 != 0;
  uVar19 = uVar19 - 1;
  if (bVar21) {
    pbVar16 = pbVar17 + 2;
    uVar18 = (int)(char)*pbVar17 << 8 | (int)(char)pbVar17[1];
    if (uVar18 == 0x4150) {
      bVar1 = *pbVar16;
      kVar5 = kh_put_map(hdr->preservation_map,"AP",&r);
      if (r == -1) goto LAB_001158a6;
      unaff_RBP = (byte *)((ulong)unaff_RBP & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU);
      pbVar17 = pbVar17 + 3;
      hdr->preservation_map->vals[kVar5].p = (char *)unaff_RBP;
      hdr->AP_delta = (int)(char)bVar1;
    }
    else if (uVar18 == 0x5549) {
      bVar1 = *pbVar16;
      kVar5 = kh_put_map(hdr->preservation_map,"UI",&r);
      if (r == -1) goto LAB_001158a6;
      unaff_RBP = (byte *)((ulong)unaff_RBP & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU);
      pbVar17 = pbVar17 + 3;
      hdr->preservation_map->vals[kVar5].p = (char *)unaff_RBP;
      hdr->unmapped_qs_included = (int)(char)bVar1;
    }
    else if (uVar18 == 0x5049) {
      bVar1 = *pbVar16;
      kVar5 = kh_put_map(hdr->preservation_map,"PI",&r);
      if (r == -1) goto LAB_001158a6;
      unaff_RBP = (byte *)((ulong)unaff_RBP & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU);
      pbVar17 = pbVar17 + 3;
      hdr->preservation_map->vals[kVar5].p = (char *)unaff_RBP;
      hdr->unmapped_placed = (int)(char)bVar1;
    }
    else {
      if (uVar18 != 0x524e) {
        if (uVar18 == 0x5252) {
          bVar1 = *pbVar16;
          kVar5 = kh_put_map(hdr->preservation_map,"RR",&r);
          if (r == -1) goto LAB_001158a6;
          unaff_RBP = (byte *)((ulong)unaff_RBP & 0xffffffff00000000 |
                              (long)(char)bVar1 & 0xffffffffU);
          pbVar17 = pbVar17 + 3;
          hdr->preservation_map->vals[kVar5].p = (char *)unaff_RBP;
          fd->no_ref = (uint)(bVar1 == 0);
          goto LAB_0011484a;
        }
        if (uVar18 == 0x534d) {
          hdr->substitution_matrix[0][pbVar17[2] >> 6] = 'C';
          hdr->substitution_matrix[0][pbVar17[2] >> 4 & 3] = 'G';
          hdr->substitution_matrix[0][pbVar17[2] >> 2 & 3] = 'T';
          hdr->substitution_matrix[0][pbVar17[2] & 3] = 'N';
          hdr->substitution_matrix[1][pbVar17[3] >> 6] = 'A';
          hdr->substitution_matrix[1][pbVar17[3] >> 4 & 3] = 'G';
          hdr->substitution_matrix[1][pbVar17[3] >> 2 & 3] = 'T';
          hdr->substitution_matrix[1][pbVar17[3] & 3] = 'N';
          hdr->substitution_matrix[2][pbVar17[4] >> 6] = 'A';
          hdr->substitution_matrix[2][pbVar17[4] >> 4 & 3] = 'C';
          hdr->substitution_matrix[2][pbVar17[4] >> 2 & 3] = 'T';
          hdr->substitution_matrix[2][pbVar17[4] & 3] = 'N';
          hdr->substitution_matrix[3][pbVar17[5] >> 6] = 'A';
          hdr->substitution_matrix[3][pbVar17[5] >> 4 & 3] = 'C';
          hdr->substitution_matrix[3][pbVar17[5] >> 2 & 3] = 'G';
          hdr->substitution_matrix[3][pbVar17[5] & 3] = 'N';
          hdr->substitution_matrix[4][pbVar17[6] >> 6] = 'A';
          hdr->substitution_matrix[4][pbVar17[6] >> 4 & 3] = 'C';
          hdr->substitution_matrix[4][pbVar17[6] >> 2 & 3] = 'G';
          hdr->substitution_matrix[4][pbVar17[6] & 3] = 'T';
          uVar18 = kh_put_map(hdr->preservation_map,"SM",&r);
          if (r == -1) goto LAB_001158a6;
          pbVar17 = pbVar17 + 7;
        }
        else {
          if (uVar18 != 0x5444) {
            if (uVar18 == 0x4d49) {
              bVar1 = *pbVar16;
              kVar5 = kh_put_map(hdr->preservation_map,"MI",&r);
              if (r == -1) goto LAB_001158a6;
              unaff_RBP = (byte *)((ulong)unaff_RBP & 0xffffffff00000000 |
                                  (long)(char)bVar1 & 0xffffffffU);
              pbVar17 = pbVar17 + 3;
              hdr->preservation_map->vals[kVar5].p = (char *)unaff_RBP;
              hdr->mapped_qs_included = (int)(char)bVar1;
            }
            else {
              fprintf(_stderr,"Unrecognised preservation map key %c%c\n");
              pbVar17 = pbVar17 + 3;
            }
            goto LAB_0011484a;
          }
          uVar6 = cram_decode_TD((char *)pbVar16,hdr);
          if (((int)uVar6 < 0) || (uVar18 = kh_put_map(hdr->preservation_map,"TD",&r), r == -1))
          goto LAB_001158a6;
          pbVar17 = pbVar16 + uVar6;
        }
        hdr->preservation_map->vals[uVar18].p = (char *)pbVar16;
        unaff_RBP = pbVar16;
        goto LAB_0011484a;
      }
      bVar1 = *pbVar16;
      kVar5 = kh_put_map(hdr->preservation_map,"RN",&r);
      if (r == -1) goto LAB_001158a6;
      unaff_RBP = (byte *)((ulong)unaff_RBP & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU);
      pbVar17 = pbVar17 + 3;
      hdr->preservation_map->vals[kVar5].p = (char *)unaff_RBP;
      hdr->read_names_included = (int)(char)bVar1;
    }
    goto LAB_0011484a;
  }
  if ((long)pbVar17 - (long)local_50 == (long)(int)local_48) {
    bVar1 = *pbVar17;
    uVar18 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar19 = (uint)pbVar17[1];
      if (bVar1 < 0xc0) {
        local_50 = (byte *)CONCAT44(local_50._4_4_,(uVar18 & 0x3f) << 8 | uVar19);
        lStack_70 = 2;
      }
      else if (bVar1 < 0xe0) {
        local_50 = (byte *)CONCAT44(local_50._4_4_,
                                    (uVar18 & 0x1f) << 0x10 | uVar19 << 8 | (uint)pbVar17[2]);
        lStack_70 = 3;
      }
      else if (bVar1 < 0xf0) {
        local_50 = (byte *)CONCAT44(local_50._4_4_,
                                    (uVar18 & 0xf) << 0x18 | uVar19 << 0x10 | (uint)pbVar17[2] << 8
                                    | (uint)pbVar17[3]);
        lStack_70 = 4;
      }
      else {
        local_50 = (byte *)CONCAT44(local_50._4_4_,
                                    pbVar17[4] & 0xf |
                                    (uint)pbVar17[3] << 4 |
                                    (uint)pbVar17[2] << 0xc | uVar19 << 0x14 | uVar18 << 0x1c);
        lStack_70 = 5;
      }
    }
    else {
      local_50 = (byte *)CONCAT44(local_50._4_4_,uVar18);
      lStack_70 = 1;
    }
    local_48 = pbVar17 + lStack_70;
    bVar1 = pbVar17[lStack_70];
    uVar18 = (uint)bVar1;
    lStack_70 = 1;
    if ((char)bVar1 < '\0') {
      uVar19 = (uint)bVar1;
      uVar18 = (uint)local_48[1];
      if (bVar1 < 0xc0) {
        uVar18 = (uVar19 & 0x3f) << 8 | uVar18;
        lStack_70 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar18 = (uVar19 & 0x1f) << 0x10 | uVar18 << 8 | (uint)local_48[2];
        lStack_70 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar18 = (uVar19 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)local_48[2] << 8 |
                 (uint)local_48[3];
        lStack_70 = 4;
      }
      else {
        uVar18 = local_48[4] & 0xf |
                 (uint)local_48[3] << 4 | (uint)local_48[2] << 0xc | uVar18 << 0x14 | uVar19 << 0x1c
        ;
        lStack_70 = 5;
      }
    }
    pbVar17 = local_48 + lStack_70;
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    while (pbVar16 = pbVar17, bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
      pcVar9 = (cram_map *)malloc(0x20);
      if (pcVar9 == (cram_map *)0x0) goto LAB_001158a6;
      bVar1 = pbVar16[2];
      cVar14 = (cram_encoding)bVar1;
      if ((char)bVar1 < '\0') {
        uVar19 = (uint)bVar1;
        cVar14 = (cram_encoding)pbVar16[3];
        if (bVar1 < 0xc0) {
          cVar14 = (uVar19 & 0x3f) << 8 | cVar14;
          lStack_70 = 2;
        }
        else if (bVar1 < 0xe0) {
          cVar14 = (uVar19 & 0x1f) << 0x10 | cVar14 << 8 | (uint)pbVar16[4];
          lStack_70 = 3;
        }
        else if (bVar1 < 0xf0) {
          cVar14 = (uVar19 & 0xf) << 0x18 | cVar14 << 0x10 | (uint)pbVar16[4] << 8 |
                   (uint)pbVar16[5];
          lStack_70 = 4;
        }
        else {
          cVar14 = pbVar16[6] & (E_GOLOMB_RICE|E_SUBEXP) |
                   (uint)pbVar16[5] << 4 | (uint)pbVar16[4] << 0xc | cVar14 << 0x14 | uVar19 << 0x1c
          ;
          lStack_70 = 5;
        }
      }
      else {
        lStack_70 = 1;
      }
      lVar15 = lStack_70 + 2;
      bVar1 = pbVar16[lStack_70 + 2];
      uVar19 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar6 = (uint)bVar1;
        uVar19 = (uint)pbVar16[lStack_70 + 3];
        if (bVar1 < 0xc0) {
          uVar19 = (uVar6 & 0x3f) << 8 | uVar19;
          lStack_70 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar19 = (uVar6 & 0x1f) << 0x10 | uVar19 << 8 | (uint)pbVar16[lStack_70 + 4];
          lStack_70 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar19 = (uVar6 & 0xf) << 0x18 | uVar19 << 0x10 | (uint)pbVar16[lStack_70 + 4] << 8 |
                   (uint)pbVar16[lStack_70 + 5];
          lStack_70 = 4;
        }
        else {
          uVar19 = pbVar16[lStack_70 + 6] & 0xf |
                   (uint)pbVar16[lStack_70 + 5] << 4 |
                   (uint)pbVar16[lStack_70 + 4] << 0xc | uVar19 << 0x14 | uVar6 << 0x1c;
          lStack_70 = 5;
        }
      }
      else {
        lStack_70 = 1;
      }
      pbVar17 = pbVar16 + lStack_70 + lVar15;
      pcVar9->key = (int)(char)pbVar16[1] | (int)(char)*pbVar16 << 8;
      pcVar9->encoding = cVar14;
      pcVar9->size = uVar19;
      pcVar9->offset = (int)pbVar17 - *(int *)&local_38->data;
      pcVar9->codec = (cram_codec *)0x0;
      if (cVar14 != E_NULL) {
        bVar1 = *pbVar16;
        bVar21 = false;
        switch(bVar1) {
        case 0x41:
          if (pbVar16[1] == 0x50) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x11] = pcVar10;
            break;
          }
LAB_001154a0:
          fprintf(_stderr,"Unrecognised key: %.2s\n",pbVar16);
          goto LAB_00115524;
        case 0x42:
          if (pbVar16[1] == 0x46) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0xf] = pcVar10;
          }
          else {
            bVar1 = pbVar16[1];
            if (bVar1 == 0x41) {
              pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE,fd->version);
              hdr->codecs[0x1e] = pcVar10;
            }
            else if (bVar1 == 0x42) {
              pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE_ARRAY,fd->version);
              hdr->codecs[0x25] = pcVar10;
            }
            else {
              if (bVar1 != 0x53) goto LAB_001154a0;
              pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE,fd->version);
              hdr->codecs[0x1f] = pcVar10;
            }
          }
          break;
        case 0x43:
          if (pbVar16[1] != 0x46) goto LAB_001154a0;
          pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
          hdr->codecs[0x10] = pcVar10;
          break;
        case 0x44:
          if (pbVar16[1] != 0x4c) goto LAB_001154a0;
          pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
          hdr->codecs[0x1d] = pcVar10;
          break;
        default:
switchD_00114f97_caseD_45:
          if (bVar1 == 0x48) {
            if (pbVar16[1] != 0x43) goto LAB_0011543e;
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x24] = pcVar10;
          }
          else if ((bVar1 == 0x50) && (pbVar16[1] == 0x44)) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x23] = pcVar10;
          }
          else {
LAB_0011543e:
            if ((bVar21) && (pbVar16[1] == 0x4e)) {
              pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE_ARRAY_BLOCK,
                                          fd->version);
              hdr->codecs[0xb] = pcVar10;
            }
            else {
              if (bVar1 != 0x51) goto LAB_001154a0;
              if (pbVar16[1] == 0x51) {
                pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE_ARRAY,fd->version);
                hdr->codecs[0x26] = pcVar10;
              }
              else {
                if (pbVar16[1] != 0x53) goto LAB_001154a0;
                pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE,fd->version);
                hdr->codecs[0xc] = pcVar10;
              }
            }
          }
          break;
        case 0x46:
          bVar1 = pbVar16[1];
          if (bVar1 == 0x43) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE,fd->version);
            hdr->codecs[0x1b] = pcVar10;
          }
          else if (bVar1 == 0x50) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x1c] = pcVar10;
          }
          else {
            if (bVar1 != 0x4e) goto LAB_001154a0;
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x1a] = pcVar10;
          }
          break;
        case 0x49:
          if (pbVar16[1] != 0x4e) goto LAB_001154a0;
          pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE_ARRAY,fd->version);
          hdr->codecs[0xd] = pcVar10;
          break;
        case 0x4d:
          if (pbVar16[1] == 0x51) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x13] = pcVar10;
          }
          else {
            if (pbVar16[1] != 0x46) goto LAB_001154a0;
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x15] = pcVar10;
          }
          break;
        case 0x4e:
          bVar1 = pbVar16[1];
          if (bVar1 == 0x46) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x18] = pcVar10;
          }
          else if (bVar1 == 0x50) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x17] = pcVar10;
          }
          else {
            if (bVar1 != 0x53) goto LAB_001154a0;
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x14] = pcVar10;
          }
          break;
        case 0x52:
          bVar2 = pbVar16[1];
          if (bVar2 == 0x47) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x12] = pcVar10;
          }
          else if (bVar2 == 0x4c) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x19] = pcVar10;
          }
          else if (bVar2 == 0x49) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x21] = pcVar10;
          }
          else {
            bVar21 = true;
            if (pbVar16[1] != 0x53) goto switchD_00114f97_caseD_45;
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x22] = pcVar10;
          }
          break;
        case 0x53:
          if (pbVar16[1] != 0x43) goto LAB_001154a0;
          pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE_ARRAY,fd->version);
          hdr->codecs[0xe] = pcVar10;
          break;
        case 0x54:
          bVar1 = pbVar16[1];
          if (bVar1 == 0x43) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_BYTE,fd->version);
            hdr->codecs[0x2c] = pcVar10;
          }
          else if (bVar1 == 0x4e) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x27] = pcVar10;
          }
          else if (bVar1 == 0x53) {
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x16] = pcVar10;
          }
          else {
            bVar1 = pbVar16[1];
            if ((bVar1 == 0x56) || (bVar1 == 0x4d)) goto LAB_00115524;
            if (bVar1 != 0x4c) goto LAB_001154a0;
            pcVar10 = cram_decoder_init(cVar14,(char *)pbVar17,uVar19,E_INT,fd->version);
            hdr->codecs[0x20] = pcVar10;
          }
        }
        if (pcVar10 == (cram_codec *)0x0) goto LAB_001158a6;
LAB_00115524:
        pcVar9->next = local_40[(uint)pbVar16[1] + (uint)*pbVar16 + (uint)*pbVar16 * 2 & 0x1f];
        local_40[(uint)pbVar16[1] + (uint)*pbVar16 + (uint)*pbVar16 * 2 & 0x1f] = pcVar9;
        pbVar17 = pbVar17 + (int)uVar19;
      }
    }
    if ((long)pbVar16 - (long)local_48 == (long)(int)local_50) {
      bVar1 = *pbVar16;
      uVar18 = (uint)bVar1;
      lStack_70 = 1;
      if ((char)bVar1 < '\0') {
        uVar19 = (uint)bVar1;
        uVar18 = (uint)pbVar16[1];
        if (bVar1 < 0xc0) {
          uVar18 = (uVar19 & 0x3f) << 8 | uVar18;
          lStack_70 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar18 = (uVar19 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar16[2];
          lStack_70 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar18 = (uVar19 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)pbVar16[2] << 8 |
                   (uint)pbVar16[3];
          lStack_70 = 4;
        }
        else {
          uVar18 = pbVar16[4] & 0xf |
                   (uint)pbVar16[3] << 4 | (uint)pbVar16[2] << 0xc | uVar18 << 0x14 | uVar19 << 0x1c
          ;
          lStack_70 = 5;
        }
      }
      local_48 = pbVar16 + lStack_70;
      bVar1 = pbVar16[lStack_70];
      uVar19 = (uint)bVar1;
      local_40 = (cram_map **)CONCAT44(local_40._4_4_,uVar18);
      lStack_70 = 1;
      if ((char)bVar1 < '\0') {
        uVar18 = (uint)bVar1;
        uVar19 = (uint)local_48[1];
        if (bVar1 < 0xc0) {
          uVar19 = (uVar18 & 0x3f) << 8 | uVar19;
          lStack_70 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar19 = (uVar18 & 0x1f) << 0x10 | uVar19 << 8 | (uint)local_48[2];
          lStack_70 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar19 = (uVar18 & 0xf) << 0x18 | uVar19 << 0x10 | (uint)local_48[2] << 8 |
                   (uint)local_48[3];
          lStack_70 = 4;
        }
        else {
          uVar19 = local_48[4] & 0xf |
                   (uint)local_48[3] << 4 |
                   (uint)local_48[2] << 0xc | uVar19 << 0x14 | uVar18 << 0x1c;
          lStack_70 = 5;
        }
      }
      pbVar17 = local_48 + lStack_70;
      uVar18 = 0;
      if (0 < (int)uVar19) {
        uVar18 = uVar19;
      }
      while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
        pcVar11 = (cram_block_compression_hdr *)malloc(0x20);
        if (pcVar11 == (cram_block_compression_hdr *)0x0) goto LAB_001158a6;
        pcVar11->ref_seq_id =
             (int)(char)pbVar17[3] | (int)(char)pbVar17[2] << 8 | (int)(char)pbVar17[1] << 0x10;
        bVar1 = pbVar17[4];
        cVar14 = (cram_encoding)bVar1;
        if ((char)bVar1 < '\0') {
          uVar19 = (uint)bVar1;
          cVar14 = (cram_encoding)pbVar17[5];
          if (bVar1 < 0xc0) {
            cVar14 = (uVar19 & 0x3f) << 8 | cVar14;
            lStack_70 = 2;
          }
          else if (bVar1 < 0xe0) {
            cVar14 = (uVar19 & 0x1f) << 0x10 | cVar14 << 8 | (uint)pbVar17[6];
            lStack_70 = 3;
          }
          else if (bVar1 < 0xf0) {
            cVar14 = (uVar19 & 0xf) << 0x18 | cVar14 << 0x10 | (uint)pbVar17[6] << 8 |
                     (uint)pbVar17[7];
            lStack_70 = 4;
          }
          else {
            cVar14 = pbVar17[8] & (E_GOLOMB_RICE|E_SUBEXP) |
                     (uint)pbVar17[7] << 4 |
                     (uint)pbVar17[6] << 0xc | cVar14 << 0x14 | uVar19 << 0x1c;
            lStack_70 = 5;
          }
        }
        else {
          lStack_70 = 1;
        }
        lVar15 = lStack_70 + 4;
        bVar1 = pbVar17[lStack_70 + 4];
        uVar19 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar6 = (uint)bVar1;
          uVar19 = (uint)pbVar17[lStack_70 + 5];
          if (bVar1 < 0xc0) {
            uVar19 = (uVar6 & 0x3f) << 8 | uVar19;
            lStack_70 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar19 = (uVar6 & 0x1f) << 0x10 | uVar19 << 8 | (uint)pbVar17[lStack_70 + 6];
            lStack_70 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar19 = (uVar6 & 0xf) << 0x18 | uVar19 << 0x10 | (uint)pbVar17[lStack_70 + 6] << 8 |
                     (uint)pbVar17[lStack_70 + 7];
            lStack_70 = 4;
          }
          else {
            uVar19 = pbVar17[lStack_70 + 8] & 0xf |
                     (uint)pbVar17[lStack_70 + 7] << 4 |
                     (uint)pbVar17[lStack_70 + 6] << 0xc | uVar19 << 0x14 | uVar6 << 0x1c;
            lStack_70 = 5;
          }
        }
        else {
          lStack_70 = 1;
        }
        pbVar16 = pbVar17 + lStack_70 + lVar15;
        pcVar11->ref_seq_start = cVar14;
        pcVar11->num_records = uVar19;
        pcVar11->ref_seq_span = (int)pbVar16 - *(int *)&local_38->data;
        pcVar10 = cram_decoder_init(cVar14,(char *)pbVar16,uVar19,E_BYTE_ARRAY_BLOCK,fd->version);
        *(cram_codec **)&pcVar11->num_landmarks = pcVar10;
        if (pcVar10 == (cram_codec *)0x0) {
          cram_free_compression_header(hdr);
          hdr = pcVar11;
          goto LAB_0011468c;
        }
        pcVar11->landmark =
             &hdr->tag_encoding_map
              [(uint)pbVar17[2] + (uint)pbVar17[1] + (uint)pbVar17[1] * 2 & 0x1f]->key;
        hdr->tag_encoding_map[(uint)pbVar17[2] + (uint)pbVar17[1] + (uint)pbVar17[1] * 2 & 0x1f] =
             (cram_map *)pcVar11;
        pbVar17 = pbVar16 + (int)uVar19;
      }
      if ((long)pbVar17 - (long)local_48 == (long)(int)local_40) {
        return hdr;
      }
    }
  }
LAB_001158a6:
  cram_free_compression_header(hdr);
  return (cram_block_compression_hdr *)0x0;
}

Assistant:

cram_block_compression_hdr *cram_decode_compression_header(cram_fd *fd,
							   cram_block *b) {
    char *cp, *cp_copy;
    cram_block_compression_hdr *hdr = calloc(1, sizeof(*hdr));
    int i;
    int32_t map_size, map_count;

    if (!hdr)
	return NULL;

    if (b->method != RAW) {
	if (cram_uncompress_block(b)) {
	    free(hdr);
	    return NULL;
	}
    }

    cp = (char *)b->data;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	cp += itf8_get(cp, &hdr->ref_seq_id);
	cp += itf8_get(cp, &hdr->ref_seq_start);
	cp += itf8_get(cp, &hdr->ref_seq_span);
	cp += itf8_get(cp, &hdr->num_records);
	cp += itf8_get(cp, &hdr->num_landmarks);
	if (!(hdr->landmark = malloc(hdr->num_landmarks * sizeof(int32_t)))) {
	    free(hdr);
	    return NULL;
	}
	for (i = 0; i < hdr->num_landmarks; i++) {
	    cp += itf8_get(cp, &hdr->landmark[i]);
	}
    }

    hdr->preservation_map = kh_init(map);

    memset(hdr->rec_encoding_map, 0,
	   CRAM_MAP_HASH * sizeof(hdr->rec_encoding_map[0]));
    memset(hdr->tag_encoding_map, 0,
	   CRAM_MAP_HASH * sizeof(hdr->tag_encoding_map[0]));

    if (!hdr->preservation_map) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Initialise defaults for preservation map */
    hdr->mapped_qs_included = 0;
    hdr->unmapped_qs_included = 0;
    hdr->unmapped_placed = 0;
    hdr->qs_included = 0;
    hdr->read_names_included = 0;
    hdr->AP_delta = 1;
    memcpy(hdr->substitution_matrix, "CGTNAGTNACTNACGNACGT", 20);

    /* Preservation map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	pmap_t hd;
	khint_t k;
	int r;

	cp += 2;
	switch(CRAM_KEY(cp[-2],cp[-1])) {
	case CRAM_KEY('M','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "MI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->mapped_qs_included = hd.i;
	    break;

	case CRAM_KEY('U','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "UI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->unmapped_qs_included = hd.i;
	    break;

	case CRAM_KEY('P','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "PI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->unmapped_placed = hd.i;
	    break;

	case CRAM_KEY('R','N'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "RN", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->read_names_included = hd.i;
	    break;

	case CRAM_KEY('A','P'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "AP", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->AP_delta = hd.i;
	    break;

	case CRAM_KEY('R','R'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "RR", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    fd->no_ref = !hd.i;
	    break;

	case CRAM_KEY('S','M'):
	    hdr->substitution_matrix[0][(cp[0]>>6)&3] = 'C';
	    hdr->substitution_matrix[0][(cp[0]>>4)&3] = 'G';
	    hdr->substitution_matrix[0][(cp[0]>>2)&3] = 'T';
	    hdr->substitution_matrix[0][(cp[0]>>0)&3] = 'N';

	    hdr->substitution_matrix[1][(cp[1]>>6)&3] = 'A';
	    hdr->substitution_matrix[1][(cp[1]>>4)&3] = 'G';
	    hdr->substitution_matrix[1][(cp[1]>>2)&3] = 'T';
	    hdr->substitution_matrix[1][(cp[1]>>0)&3] = 'N';

	    hdr->substitution_matrix[2][(cp[2]>>6)&3] = 'A';
	    hdr->substitution_matrix[2][(cp[2]>>4)&3] = 'C';
	    hdr->substitution_matrix[2][(cp[2]>>2)&3] = 'T';
	    hdr->substitution_matrix[2][(cp[2]>>0)&3] = 'N';

	    hdr->substitution_matrix[3][(cp[3]>>6)&3] = 'A';
	    hdr->substitution_matrix[3][(cp[3]>>4)&3] = 'C';
	    hdr->substitution_matrix[3][(cp[3]>>2)&3] = 'G';
	    hdr->substitution_matrix[3][(cp[3]>>0)&3] = 'N';

	    hdr->substitution_matrix[4][(cp[4]>>6)&3] = 'A';
	    hdr->substitution_matrix[4][(cp[4]>>4)&3] = 'C';
	    hdr->substitution_matrix[4][(cp[4]>>2)&3] = 'G';
	    hdr->substitution_matrix[4][(cp[4]>>0)&3] = 'T';

	    hd.p = cp;
	    cp += 5;

	    k = kh_put(map, hdr->preservation_map, "SM", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	    kh_val(hdr->preservation_map, k) = hd;
	    break;

	case CRAM_KEY('T','D'): {
	    int sz = cram_decode_TD(cp, hdr); // tag dictionary
	    if (sz < 0) {
		cram_free_compression_header(hdr);
		return NULL;
	    }

	    hd.p = cp;
	    cp += sz;

	    k = kh_put(map, hdr->preservation_map, "TD", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	    kh_val(hdr->preservation_map, k) = hd;
	    break;
	}

	default:
	    fprintf(stderr, "Unrecognised preservation map key %c%c\n",
		    cp[-2], cp[-1]);
	    // guess byte;
	    cp++;
	    break;
	}
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Record encoding map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	char *key = cp;
	int32_t encoding;
	int32_t size;
	cram_map *m = malloc(sizeof(*m)); // FIXME: use pooled_alloc

	if (!m) {
	    cram_free_compression_header(hdr);
	    return NULL;
	}

	cp += 2;
	cp += itf8_get(cp, &encoding);
	cp += itf8_get(cp, &size);

	// Fill out cram_map purely for cram_dump to dump out.
	m->key = (key[0]<<8)|key[1];
	m->encoding = encoding;
	m->size     = size;
	m->offset   = cp - (char *)b->data;
	m->codec = NULL;

	if (m->encoding == E_NULL)
	    continue;

	//printf("%s codes for %.2s\n", cram_encoding2str(encoding), key);

	/*
	 * For CRAM1.0 CF and BF are Byte and not Int.
	 * Practically speaking it makes no difference unless we have a
	 * 1.0 format file that stores these in EXTERNAL as only then
	 * does Byte vs Int matter.
	 *
	 * Neither this C code nor Java reference implementations did this,
	 * so we gloss over it and treat them as int.
	 */

	if (key[0] == 'B' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_BF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'C' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_CF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'I') {
	    if (!(hdr->codecs[DS_RI] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_RL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'A' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_AP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'G') {
	    if (!(hdr->codecs[DS_RG] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'M' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_MF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_NS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_NP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_TS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_NF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_TC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_TN] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_FN] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_FC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_FP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_BS] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'I' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_IN] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'S' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_SC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'D' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_DL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'A') {
	    if (!(hdr->codecs[DS_BA] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'B') {
	    if (!(hdr->codecs[DS_BB] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_RS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'P' && key[1] == 'D') {
	    if (!(hdr->codecs[DS_PD] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'H' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_HC] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'M' && key[1] == 'Q') {
	    if (!(hdr->codecs[DS_MQ] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_RN] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY_BLOCK,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'Q' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_QS] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'Q' && key[1] == 'Q') {
	    if (!(hdr->codecs[DS_QQ] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_TL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'M') {
	} else if (key[0] == 'T' && key[1] == 'V') {
	} else
	    fprintf(stderr, "Unrecognised key: %.2s\n", key);

	cp += size;

	m->next = hdr->rec_encoding_map[CRAM_MAP(key[0], key[1])];
	hdr->rec_encoding_map[CRAM_MAP(key[0], key[1])] = m;
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Tag encoding map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	int32_t encoding;
	int32_t size;
	cram_map *m = malloc(sizeof(*m)); // FIXME: use pooled_alloc
	char *key = cp+1;

	if (!m) {
	    cram_free_compression_header(hdr);
	    return NULL;
	}

	m->key = (key[0]<<16)|(key[1]<<8)|key[2];

	cp += 4; // Strictly ITF8, but this suffices
	cp += itf8_get(cp, &encoding);
	cp += itf8_get(cp, &size);

	m->encoding = encoding;
	m->size     = size;
	m->offset   = cp - (char *)b->data;
	if (!(m->codec = cram_decoder_init(encoding, cp, size,
					   E_BYTE_ARRAY_BLOCK, fd->version))) {
	    cram_free_compression_header(hdr);
	    free(m);
	    return NULL;
	}
	
	cp += size;

	m->next = hdr->tag_encoding_map[CRAM_MAP(key[0],key[1])];
	hdr->tag_encoding_map[CRAM_MAP(key[0],key[1])] = m;
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    return hdr;
}